

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O2

bool __thiscall ON_Polyline::IsClosed(ON_Polyline *this,double tolerance)

{
  int iVar1;
  ON_3dPoint *pOVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  double dVar7;
  
  iVar1 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (3 < iVar1) {
    uVar4 = (ulong)(iVar1 - 1);
    pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
    if (tolerance <= 0.0) {
      bVar6 = ON_PointsAreCoincident(3,false,&pOVar2->x,&pOVar2[uVar4].x);
      if (!bVar6) {
        return false;
      }
      lVar5 = 0x18;
      while( true ) {
        bVar6 = uVar4 * 0x18 - lVar5 != 0;
        if (!bVar6) {
          return bVar6;
        }
        pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
        bVar3 = ON_PointsAreCoincident(3,false,(double *)((long)&pOVar2->x + lVar5),&pOVar2->x);
        if ((!bVar3) &&
           (pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a,
           bVar3 = ON_PointsAreCoincident
                             (3,false,(double *)((long)&pOVar2->x + lVar5),&pOVar2[uVar4].x), !bVar3
           )) break;
        lVar5 = lVar5 + 0x18;
      }
      return bVar6;
    }
    dVar7 = ON_3dPoint::DistanceTo(pOVar2,pOVar2 + uVar4);
    if (dVar7 <= tolerance) {
      lVar5 = 0x18;
      while( true ) {
        bVar6 = uVar4 * 0x18 - lVar5 != 0;
        if (!bVar6) {
          return bVar6;
        }
        pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
        dVar7 = ON_3dPoint::DistanceTo((ON_3dPoint *)((long)&pOVar2->x + lVar5),pOVar2);
        if ((tolerance < dVar7) &&
           (pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a,
           dVar7 = ON_3dPoint::DistanceTo((ON_3dPoint *)((long)&pOVar2->x + lVar5),pOVar2 + uVar4),
           tolerance < dVar7)) break;
        lVar5 = lVar5 + 0x18;
      }
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool ON_Polyline::IsClosed( double tolerance ) const
{
  bool rc = false;
  const int count = m_count-1;
  int i;
  if ( count >= 3 )
  {
    if ( tolerance > 0.0 )
    {
      if ( m_a[0].DistanceTo(m_a[count]) <= tolerance ) {
        for ( i = 1; i < count; i++ ) {
          if (   m_a[i].DistanceTo(m_a[0]) > tolerance 
              && m_a[i].DistanceTo(m_a[count]) > tolerance ) 
          {
             rc = true;
             break;
          }
        }
      }
    }
    else
    {
      if ( ON_PointsAreCoincident(3,false,&m_a[0].x,&m_a[count].x) ) 
      {
        for ( i = 1; i < count; i++ ) {
          if (    !ON_PointsAreCoincident(3,false,&m_a[i].x,&m_a[0].x) 
               && !ON_PointsAreCoincident(3,false,&m_a[i].x,&m_a[count].x) 
             )
          {
            rc = true;
            break;
          }
        }
      }
    }
  }
  return rc;
}